

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O0

uint anon_unknown.dwarf_2a5d58::getUsbAttributeUint(udev_device *udevDevice,string *attributeName)

{
  char *__nptr;
  ulong uVar1;
  udev_device *in_RSI;
  long in_RDI;
  uint value;
  char *attribute;
  undefined4 local_24;
  string *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 0;
  }
  else {
    __nptr = getUsbAttribute(in_RSI,in_stack_ffffffffffffffe0);
    local_24 = 0;
    if (__nptr != (char *)0x0) {
      uVar1 = strtoul(__nptr,(char **)0x0,0x10);
      local_24 = (uint)uVar1;
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

unsigned int getUsbAttributeUint(udev_device* udevDevice, const std::string& attributeName)
    {
        if (!udevDevice)
            return 0;

        const char* attribute = getUsbAttribute(udevDevice, attributeName);
        unsigned int value = 0;

        if (attribute)
            value = static_cast<unsigned int>(std::strtoul(attribute, NULL, 16));

        return value;
    }